

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O2

char ZXing::ToDigit<char>(int i)

{
  long *plVar1;
  allocator<char> local_31;
  uint *local_30;
  long local_28;
  uint local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  if ((uint)i < 10) {
    return (byte)i | 0x30;
  }
  plVar1 = (long *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Invalid digit value",&local_31);
  *plVar1 = (long)(plVar1 + 2);
  if (local_30 == &local_20) {
    *(uint *)(plVar1 + 2) = local_20;
    *(undefined4 *)((long)plVar1 + 0x14) = uStack_1c;
    *(undefined4 *)(plVar1 + 3) = uStack_18;
    *(undefined4 *)((long)plVar1 + 0x1c) = uStack_14;
  }
  else {
    *plVar1 = (long)local_30;
    plVar1[2] = CONCAT44(uStack_1c,local_20);
  }
  plVar1[1] = local_28;
  local_28 = 0;
  local_20 = local_20 & 0xffffff00;
  plVar1[4] = (long)"src/ZXAlgorithms.h";
  *(undefined2 *)(plVar1 + 5) = 0x67;
  *(undefined1 *)((long)plVar1 + 0x2a) = 1;
  local_30 = &local_20;
  __cxa_throw(plVar1,&Error::typeinfo,Error::~Error);
}

Assistant:

T ToDigit(int i)
{
	if (i < 0 || i > 9)
		throw FormatError("Invalid digit value");
	return static_cast<T>('0' + i);
}